

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O0

void __thiscall CFGGrindReader::matchToken(CFGGrindReader *this,Type type)

{
  Lexeme local_50;
  Type local_14;
  CFGGrindReader *pCStack_10;
  Type type_local;
  CFGGrindReader *this_local;
  
  local_14 = type;
  pCStack_10 = this;
  if ((this->m_current).type == type) {
    InputTokenizer::nextToken(&local_50,&this->m_tokens);
    InputTokenizer::Lexeme::operator=(&this->m_current,&local_50);
    InputTokenizer::Lexeme::~Lexeme(&local_50);
    return;
  }
  __assert_fail("m_current.type == type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGGrindReader.cpp"
                ,0xd0,"void CFGGrindReader::matchToken(InputTokenizer::Lexeme::Type)");
}

Assistant:

void CFGGrindReader::matchToken(InputTokenizer::Lexeme::Type type) {
	assert(m_current.type == type);
	m_current = m_tokens.nextToken();
}